

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

void duckdb::Leaf::TransformToDeprecated(ART *art,Node *node)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  long lVar2;
  type paVar3;
  IndexPointer IVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  __hash_code __code;
  byte bVar7;
  long *plVar8;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  unsafe_vector<row_t> row_ids;
  ARTKey empty_key;
  Iterator it;
  unsafe_vector<row_t> local_e8;
  ARTKey local_c8;
  Iterator local_b8;
  ulong uVar9;
  
  if ((long)(node->super_IndexPointer).data < 0) {
    local_e8.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_e8.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    local_e8.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Iterator::Iterator(&local_b8,art);
    Iterator::FindMinimum(&local_b8,node);
    ARTKey::ARTKey(&local_c8);
    Iterator::Scan(&local_b8,&local_c8,0x7fffffffffffffff,&local_e8,false);
    Node::Free(art,node);
    if ((long)local_e8.super_vector<long,_std::allocator<long>_>.
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local_e8.super_vector<long,_std::allocator<long>_>.
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      uVar12 = (long)local_e8.super_vector<long,_std::allocator<long>_>.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_finish -
               (long)local_e8.super_vector<long,_std::allocator<long>_>.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start >> 3;
      lVar13 = 0;
      do {
        paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*(&art->allocators);
        IVar4 = FixedSizeAllocator::New
                          (paVar3->_M_elems[1].
                           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl)
        ;
        (node->super_IndexPointer).data = IVar4.data & 0xffffffffffffff | 0x200000000000000;
        paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                 ::operator*(&art->allocators);
        _Var1._M_head_impl =
             paVar3->_M_elems[1].
             super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
             .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
        plVar5 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                           ((IVar4.data & 0xffffffff) %
                           *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
        for (plVar8 = (long *)*plVar5; (IVar4.data & 0xffffffff) != plVar8[1];
            plVar8 = (long *)*plVar8) {
          plVar5 = plVar8;
        }
        this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(*plVar5 + 0x10));
        pdVar6 = FixedSizeBuffer::Get(this,true);
        lVar14 = (ulong)((uint)(IVar4.data >> 0x20) & 0xffffff) * (_Var1._M_head_impl)->segment_size
        ;
        lVar2 = (_Var1._M_head_impl)->bitmask_offset + lVar14;
        uVar9 = 4;
        if (uVar12 < 4) {
          uVar9 = uVar12;
        }
        bVar7 = (byte)uVar9;
        pdVar6[(_Var1._M_head_impl)->bitmask_offset + lVar14] = bVar7;
        bVar10 = 1;
        if (1 < bVar7) {
          bVar10 = bVar7;
        }
        uVar11 = 0;
        do {
          *(long *)(pdVar6 + uVar11 * 8 + lVar2 + 8) =
               local_e8.super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar13 + uVar11];
          uVar11 = uVar11 + 1;
        } while (bVar10 != uVar11);
        lVar13 = lVar13 + uVar9;
        node = (Node *)(pdVar6 + lVar2 + 0x28);
        pdVar6 = pdVar6 + lVar2 + 0x28;
        pdVar6[0] = '\0';
        pdVar6[1] = '\0';
        pdVar6[2] = '\0';
        pdVar6[3] = '\0';
        pdVar6[4] = '\0';
        pdVar6[5] = '\0';
        pdVar6[6] = '\0';
        pdVar6[7] = '\0';
        uVar12 = uVar12 - uVar9;
      } while (uVar12 != 0);
    }
    ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::~_Deque_base
              ((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
               &local_b8.nodes);
    if (local_b8.current_key.key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.current_key.key_bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_e8.super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Leaf::TransformToDeprecated(ART &art, Node &node) {
	D_ASSERT(node.GetGateStatus() == GateStatus::GATE_SET || node.GetType() == LEAF);

	// Early-out, if we never transformed this leaf.
	if (node.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		return;
	}

	// Collect all row IDs and free the nested leaf.
	unsafe_vector<row_t> row_ids;
	Iterator it(art);
	it.FindMinimum(node);
	ARTKey empty_key = ARTKey();
	it.Scan(empty_key, NumericLimits<row_t>().Maximum(), row_ids, false);
	Node::Free(art, node);
	D_ASSERT(row_ids.size() > 1);

	// Create the deprecated leaves.
	idx_t remaining = row_ids.size();
	idx_t copy_count = 0;
	reference<Node> ref(node);
	while (remaining) {
		ref.get() = Node::GetAllocator(art, LEAF).New();
		ref.get().SetMetadata(static_cast<uint8_t>(LEAF));

		auto &leaf = Node::Ref<Leaf>(art, ref, LEAF);
		auto min = MinValue(UnsafeNumericCast<idx_t>(LEAF_SIZE), remaining);
		leaf.count = UnsafeNumericCast<uint8_t>(min);

		for (uint8_t i = 0; i < leaf.count; i++) {
			leaf.row_ids[i] = row_ids[copy_count + i];
		}

		copy_count += leaf.count;
		remaining -= leaf.count;

		ref = leaf.ptr;
		leaf.ptr.Clear();
	}
}